

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pick.cpp
# Opt level: O0

size_t polyscope::pick::localIndexToGlobal(pair<polyscope::Structure_*,_unsigned_long> localPick)

{
  __tuple_element_t<0UL,_tuple<unsigned_long,_unsigned_long,_Structure_*>_> _Var1;
  bool bVar2;
  __tuple_element_t<0UL,_tuple<unsigned_long,_unsigned_long,_Structure_*>_> *p_Var3;
  __tuple_element_t<2UL,_tuple<unsigned_long,_unsigned_long,_Structure_*>_> *ppSVar4;
  runtime_error *this;
  long in_RSI;
  __tuple_element_t<2UL,_tuple<unsigned_long,_unsigned_long,_Structure_*>_> in_RDI;
  Structure *structure;
  size_t rangeEnd;
  size_t rangeStart;
  tuple<unsigned_long,_unsigned_long,_polyscope::Structure_*> *x;
  iterator __end2;
  iterator __begin2;
  vector<std::tuple<unsigned_long,_unsigned_long,_polyscope::Structure_*>,_std::allocator<std::tuple<unsigned_long,_unsigned_long,_polyscope::Structure_*>_>_>
  *__range2;
  vector<std::tuple<unsigned_long,_unsigned_long,_polyscope::Structure_*>,_std::allocator<std::tuple<unsigned_long,_unsigned_long,_polyscope::Structure_*>_>_>
  *in_stack_ffffffffffffff98;
  __normal_iterator<std::tuple<unsigned_long,_unsigned_long,_polyscope::Structure_*>_*,_std::vector<std::tuple<unsigned_long,_unsigned_long,_polyscope::Structure_*>,_std::allocator<std::tuple<unsigned_long,_unsigned_long,_polyscope::Structure_*>_>_>_>
  *in_stack_ffffffffffffffa0;
  __normal_iterator<std::tuple<unsigned_long,_unsigned_long,_polyscope::Structure_*>_*,_std::vector<std::tuple<unsigned_long,_unsigned_long,_polyscope::Structure_*>,_std::allocator<std::tuple<unsigned_long,_unsigned_long,_polyscope::Structure_*>_>_>_>
  local_28;
  undefined1 *local_20;
  __tuple_element_t<2UL,_tuple<unsigned_long,_unsigned_long,_Structure_*>_> local_18;
  long local_10;
  size_t local_8;
  
  if (in_RDI == (__tuple_element_t<2UL,_tuple<unsigned_long,_unsigned_long,_Structure_*>_>)0x0) {
    local_8 = 0;
  }
  else {
    local_20 = structureRanges;
    local_18 = in_RDI;
    local_10 = in_RSI;
    local_28._M_current =
         (tuple<unsigned_long,_unsigned_long,_polyscope::Structure_*> *)
         std::
         vector<std::tuple<unsigned_long,_unsigned_long,_polyscope::Structure_*>,_std::allocator<std::tuple<unsigned_long,_unsigned_long,_polyscope::Structure_*>_>_>
         ::begin(in_stack_ffffffffffffff98);
    std::
    vector<std::tuple<unsigned_long,_unsigned_long,_polyscope::Structure_*>,_std::allocator<std::tuple<unsigned_long,_unsigned_long,_polyscope::Structure_*>_>_>
    ::end(in_stack_ffffffffffffff98);
    while( true ) {
      bVar2 = __gnu_cxx::operator!=
                        (in_stack_ffffffffffffffa0,
                         (__normal_iterator<std::tuple<unsigned_long,_unsigned_long,_polyscope::Structure_*>_*,_std::vector<std::tuple<unsigned_long,_unsigned_long,_polyscope::Structure_*>,_std::allocator<std::tuple<unsigned_long,_unsigned_long,_polyscope::Structure_*>_>_>_>
                          *)in_stack_ffffffffffffff98);
      if (!bVar2) {
        this = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(this,"structure does not match any allocated pick range");
        __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      __gnu_cxx::
      __normal_iterator<std::tuple<unsigned_long,_unsigned_long,_polyscope::Structure_*>_*,_std::vector<std::tuple<unsigned_long,_unsigned_long,_polyscope::Structure_*>,_std::allocator<std::tuple<unsigned_long,_unsigned_long,_polyscope::Structure_*>_>_>_>
      ::operator*(&local_28);
      p_Var3 = std::get<0ul,unsigned_long,unsigned_long,polyscope::Structure*>
                         ((tuple<unsigned_long,_unsigned_long,_polyscope::Structure_*> *)0x3638e0);
      _Var1 = *p_Var3;
      std::get<1ul,unsigned_long,unsigned_long,polyscope::Structure*>
                ((tuple<unsigned_long,_unsigned_long,_polyscope::Structure_*> *)0x3638f2);
      ppSVar4 = std::get<2ul,unsigned_long,unsigned_long,polyscope::Structure*>
                          ((tuple<unsigned_long,_unsigned_long,_polyscope::Structure_*> *)0x363904);
      if (*ppSVar4 == local_18) break;
      __gnu_cxx::
      __normal_iterator<std::tuple<unsigned_long,_unsigned_long,_polyscope::Structure_*>_*,_std::vector<std::tuple<unsigned_long,_unsigned_long,_polyscope::Structure_*>,_std::allocator<std::tuple<unsigned_long,_unsigned_long,_polyscope::Structure_*>_>_>_>
      ::operator++(&local_28);
    }
    local_8 = _Var1 + local_10;
  }
  return local_8;
}

Assistant:

size_t localIndexToGlobal(std::pair<Structure*, size_t> localPick) {
  if (localPick.first == nullptr) return 0;

  for (const auto& x : structureRanges) {
    size_t rangeStart = std::get<0>(x);
    size_t rangeEnd = std::get<1>(x);
    Structure* structure = std::get<2>(x);

    if (structure == localPick.first) {
      return rangeStart + localPick.second;
    }
  }

  throw std::runtime_error("structure does not match any allocated pick range");
  return 0;
}